

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int free_decompression(archive_read *a,_7zip *zip)

{
  int iVar1;
  CPpmd7 *in_RSI;
  archive *in_RDI;
  int r;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  if (*(int *)(in_RSI->NS2Indx + 0x14) != 0) {
    lzma_end(in_RSI->FreeList + 9);
  }
  if (*(int *)(in_RSI->NS2Indx + 0x8c) != 0) {
    iVar1 = inflateEnd(in_RSI->NS2Indx + 0x1c);
    if (iVar1 != 0) {
      archive_set_error(in_RDI,-1,"Failed to clean up zlib decompressor");
      iVar2 = -0x1e;
    }
    in_RSI->NS2Indx[0x8c] = '\0';
    in_RSI->NS2Indx[0x8d] = '\0';
    in_RSI->NS2Indx[0x8e] = '\0';
    in_RSI->NS2Indx[0x8f] = '\0';
  }
  if (*(int *)(in_RSI[1].NS2BSIndx + 0xc) != 0) {
    Ppmd7_Free(in_RSI,(ISzAlloc *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    in_RSI[1].NS2BSIndx[0xc] = '\0';
    in_RSI[1].NS2BSIndx[0xd] = '\0';
    in_RSI[1].NS2BSIndx[0xe] = '\0';
    in_RSI[1].NS2BSIndx[0xf] = '\0';
  }
  return iVar2;
}

Assistant:

static int
free_decompression(struct archive_read *a, struct _7zip *zip)
{
	int r = ARCHIVE_OK;

#if !defined(HAVE_ZLIB_H) &&\
	!(defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR))
	(void)a;/* UNUSED */
#endif
#ifdef HAVE_LZMA_H
	if (zip->lzstream_valid)
		lzma_end(&(zip->lzstream));
#endif
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	if (zip->bzstream_valid) {
		if (BZ2_bzDecompressEnd(&(zip->bzstream)) != BZ_OK) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up bzip2 decompressor");
			r = ARCHIVE_FATAL;
		}
		zip->bzstream_valid = 0;
	}
#endif
#ifdef HAVE_ZLIB_H
	if (zip->stream_valid) {
		if (inflateEnd(&(zip->stream)) != Z_OK) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up zlib decompressor");
			r = ARCHIVE_FATAL;
		}
		zip->stream_valid = 0;
	}
#endif
	if (zip->ppmd7_valid) {
		__archive_ppmd7_functions.Ppmd7_Free(
			&zip->ppmd7_context, &g_szalloc);
		zip->ppmd7_valid = 0;
	}
	return (r);
}